

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureGatherTests.cpp
# Opt level: O0

string * __thiscall
gl4cts::(anonymous_namespace)::TriangleDraw::VertexShader_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  allocator<char> local_19;
  void *local_18;
  TriangleDraw *this_local;
  
  local_18 = this;
  this_local = (TriangleDraw *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,
             "#version 400                                  \nout vec2 texcoords;                           \nin vec4 Vertex;                               \nvoid main() {                                 \n   gl_Position = Vertex;                      \n   texcoords = (Vertex.xy + vec2(1.0)) / 2.0; \n}\n"
             ,&local_19);
  std::allocator<char>::~allocator(&local_19);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string VertexShader()
	{
		return "#version 400                                  \n"
			   "out vec2 texcoords;                           \n"
			   "in vec4 Vertex;                               \n"
			   "void main() {                                 \n"
			   "   gl_Position = Vertex;                      \n"
			   "   texcoords = (Vertex.xy + vec2(1.0)) / 2.0; \n"
			   "}\n";
	}